

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void returnSingleInt(Parse *pParse,char *zLabel,i64 value)

{
  Vdbe *p;
  i64 *zP4;
  int p2;
  
  p = sqlite3GetVdbe(pParse);
  p2 = pParse->nMem + 1;
  pParse->nMem = p2;
  zP4 = (i64 *)sqlite3DbMallocRaw(pParse->db,8);
  if (zP4 != (i64 *)0x0) {
    *zP4 = value;
  }
  sqlite3VdbeAddOp4(p,0x1a,0,p2,0,(char *)zP4,-0xd);
  sqlite3VdbeSetNumCols(p,1);
  sqlite3VdbeSetColName(p,0,0,zLabel,(_func_void_void_ptr *)0x0);
  sqlite3VdbeAddOp2(p,0x23,p2,1);
  return;
}

Assistant:

static void returnSingleInt(Parse *pParse, const char *zLabel, i64 value){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int mem = ++pParse->nMem;
  i64 *pI64 = sqlite3DbMallocRaw(pParse->db, sizeof(value));
  if( pI64 ){
    memcpy(pI64, &value, sizeof(value));
  }
  sqlite3VdbeAddOp4(v, OP_Int64, 0, mem, 0, (char*)pI64, P4_INT64);
  sqlite3VdbeSetNumCols(v, 1);
  sqlite3VdbeSetColName(v, 0, COLNAME_NAME, zLabel, SQLITE_STATIC);
  sqlite3VdbeAddOp2(v, OP_ResultRow, mem, 1);
}